

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigFwd.hpp
# Opt level: O2

string * __thiscall
CLI::Config::to_flag_abi_cxx11_(string *__return_storage_ptr__,Config *this,ConfigItem *item)

{
  const_reference pvVar1;
  ConversionError *__return_storage_ptr___00;
  string sStack_38;
  
  if ((long)(item->inputs).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(item->inputs).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start == 0x20) {
    pvVar1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::at(&item->inputs,0);
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pvVar1);
    return __return_storage_ptr__;
  }
  __return_storage_ptr___00 = (ConversionError *)__cxa_allocate_exception(0x38);
  ConfigItem::fullname_abi_cxx11_(&sStack_38,item);
  ConversionError::TooManyInputsFlag(__return_storage_ptr___00,&sStack_38);
  __cxa_throw(__return_storage_ptr___00,&ConversionError::typeinfo,Error::~Error);
}

Assistant:

virtual std::string to_flag(const ConfigItem &item) const {
        if(item.inputs.size() == 1) {
            return item.inputs.at(0);
        }
        throw ConversionError::TooManyInputsFlag(item.fullname());
    }